

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O3

vec4F __thiscall basisu::compute_ssim(basisu *this,imagef *a,imagef *b)

{
  float fVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  float extraout_XMM0_Da_10;
  float extraout_XMM0_Da_11;
  float extraout_XMM0_Da_12;
  float extraout_XMM0_Da_13;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Db_08;
  float extraout_XMM0_Db_09;
  float extraout_XMM0_Db_10;
  float extraout_XMM0_Db_11;
  float extraout_XMM0_Db_12;
  float extraout_XMM0_Db_13;
  vec4F vVar4;
  imagef t1;
  imagef t2;
  imagef s12;
  imagef s2_sq;
  imagef s1_sq;
  imagef mu1_mu2;
  imagef mu2_sq;
  imagef mu1_sq;
  imagef mu2;
  imagef mu1;
  imagef t3;
  imagef smap;
  imagef b_sq;
  imagef axb;
  imagef a_sq;
  vec4F local_228;
  imagef local_218;
  imagef local_1f8;
  vec4F local_1d8;
  imagef local_1c8;
  imagef local_1a8;
  imagef local_188;
  imagef local_168;
  imagef local_148;
  imagef local_128;
  imagef local_108;
  imagef local_e8;
  imagef local_c8;
  imagef local_a8;
  imagef local_88;
  imagef local_68;
  vec4F local_48;
  imagef local_38;
  float fVar2;
  undefined8 uVar3;
  
  local_68.m_width = 0;
  local_68.m_height = 0;
  local_68.m_pitch = 0;
  local_68.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_68.m_pixels.m_size = 0;
  local_68.m_pixels.m_capacity = 0;
  local_38.m_width = 0;
  local_38.m_height = 0;
  local_38.m_pitch = 0;
  local_38.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_38.m_pixels.m_size = 0;
  local_38.m_pixels.m_capacity = 0;
  local_88.m_width = 0;
  local_88.m_height = 0;
  local_88.m_pitch = 0;
  local_88.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_88.m_pixels.m_size = 0;
  local_88.m_pixels.m_capacity = 0;
  local_e8.m_width = 0;
  local_e8.m_height = 0;
  local_e8.m_pitch = 0;
  local_e8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_e8.m_pixels.m_size = 0;
  local_e8.m_pixels.m_capacity = 0;
  local_108.m_width = 0;
  local_108.m_height = 0;
  local_108.m_pitch = 0;
  local_108.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_108.m_pixels.m_size = 0;
  local_108.m_pixels.m_capacity = 0;
  local_128.m_width = 0;
  local_128.m_height = 0;
  local_128.m_pitch = 0;
  local_128.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_128.m_pixels.m_size = 0;
  local_128.m_pixels.m_capacity = 0;
  local_148.m_width = 0;
  local_148.m_height = 0;
  local_148.m_pitch = 0;
  local_148.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_148.m_pixels.m_size = 0;
  local_148.m_pixels.m_capacity = 0;
  local_168.m_width = 0;
  local_168.m_height = 0;
  local_168.m_pitch = 0;
  local_168.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_168.m_pixels.m_size = 0;
  local_168.m_pixels.m_capacity = 0;
  local_188.m_width = 0;
  local_188.m_height = 0;
  local_188.m_pitch = 0;
  local_188.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_188.m_pixels.m_size = 0;
  local_188.m_pixels.m_capacity = 0;
  local_1a8.m_width = 0;
  local_1a8.m_height = 0;
  local_1a8.m_pitch = 0;
  local_1a8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_1a8.m_pixels.m_size = 0;
  local_1a8.m_pixels.m_capacity = 0;
  local_1c8.m_width = 0;
  local_1c8.m_height = 0;
  local_1c8.m_pitch = 0;
  local_1c8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_1c8.m_pixels.m_size = 0;
  local_1c8.m_pixels.m_capacity = 0;
  local_a8.m_width = 0;
  local_a8.m_height = 0;
  local_a8.m_pitch = 0;
  local_a8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_a8.m_pixels.m_size = 0;
  local_a8.m_pixels.m_capacity = 0;
  local_218.m_width = 0;
  local_218.m_height = 0;
  local_218.m_pitch = 0;
  local_218.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_218.m_pixels.m_size = 0;
  local_218.m_pixels.m_capacity = 0;
  local_1f8.m_width = 0;
  local_1f8.m_height = 0;
  local_1f8.m_pitch = 0;
  local_1f8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_1f8.m_pixels.m_size = 0;
  local_1f8.m_pixels.m_capacity = 0;
  local_c8.m_width = 0;
  local_c8.m_height = 0;
  local_c8.m_pitch = 0;
  local_c8.m_pixels.m_p = (vec<4U,_float> *)0x0;
  local_c8.m_pixels.m_size = 0;
  local_c8.m_pixels.m_capacity = 0;
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  pow_image(a,&local_38,&local_228);
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  pow_image(b,&local_88,&local_228);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  mul_image(a,b,&local_68,&local_228);
  gaussian_filter(&local_e8,a,0xb,2.25,false,1,1);
  gaussian_filter(&local_108,b,0xb,2.25,false,1,1);
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  pow_image(&local_e8,&local_128,&local_228);
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  pow_image(&local_108,&local_148,&local_228);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  mul_image(&local_e8,&local_108,&local_168,&local_228);
  gaussian_filter(&local_188,&local_38,0xb,2.25,false,1,1);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  local_1d8.m_v[0] = -1.0;
  local_1d8.m_v[1] = -1.0;
  local_1d8.m_v[2] = -1.0;
  local_1d8.m_v[3] = -1.0;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 0.0;
  add_weighted_image(&local_188,&local_228,&local_128,&local_1d8,&local_48,&local_188);
  gaussian_filter(&local_1a8,&local_88,0xb,2.25,false,1,1);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  local_1d8.m_v[0] = -1.0;
  local_1d8.m_v[1] = -1.0;
  local_1d8.m_v[2] = -1.0;
  local_1d8.m_v[3] = -1.0;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 0.0;
  add_weighted_image(&local_1a8,&local_228,&local_148,&local_1d8,&local_48,&local_1a8);
  gaussian_filter(&local_1c8,&local_68,0xb,2.25,false,1,1);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  local_1d8.m_v[0] = -1.0;
  local_1d8.m_v[1] = -1.0;
  local_1d8.m_v[2] = -1.0;
  local_1d8.m_v[3] = -1.0;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 0.0;
  add_weighted_image(&local_1c8,&local_228,&local_168,&local_1d8,&local_48,&local_1c8);
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  local_1d8.m_v[0] = 0.0;
  local_1d8.m_v[1] = 0.0;
  local_1d8.m_v[2] = 0.0;
  local_1d8.m_v[3] = 0.0;
  scale_image(&local_168,&local_218,&local_228,&local_1d8);
  local_228.m_v[0] = 6.5025;
  local_228.m_v[1] = 6.5025;
  local_228.m_v[2] = 6.5025;
  local_228.m_v[3] = 6.5025;
  adds_image(&local_218,&local_228,&local_218);
  local_228.m_v[0] = 2.0;
  local_228.m_v[1] = 2.0;
  local_228.m_v[2] = 2.0;
  local_228.m_v[3] = 2.0;
  local_1d8.m_v[0] = 0.0;
  local_1d8.m_v[1] = 0.0;
  local_1d8.m_v[2] = 0.0;
  local_1d8.m_v[3] = 0.0;
  scale_image(&local_1c8,&local_1f8,&local_228,&local_1d8);
  local_228.m_v[0] = 58.5225;
  local_228.m_v[1] = 58.5225;
  local_228.m_v[2] = 58.5225;
  local_228.m_v[3] = 58.5225;
  adds_image(&local_1f8,&local_228,&local_1f8);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  mul_image(&local_218,&local_1f8,&local_c8,&local_228);
  add_image(&local_128,&local_148,&local_218);
  local_228.m_v[0] = 6.5025;
  local_228.m_v[1] = 6.5025;
  local_228.m_v[2] = 6.5025;
  local_228.m_v[3] = 6.5025;
  adds_image(&local_218,&local_228,&local_218);
  add_image(&local_188,&local_1a8,&local_1f8);
  local_228.m_v[0] = 58.5225;
  local_228.m_v[1] = 58.5225;
  local_228.m_v[2] = 58.5225;
  local_228.m_v[3] = 58.5225;
  adds_image(&local_1f8,&local_228,&local_1f8);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  mul_image(&local_218,&local_1f8,&local_218,&local_228);
  local_228.m_v[0] = 1.0;
  local_228.m_v[1] = 1.0;
  local_228.m_v[2] = 1.0;
  local_228.m_v[3] = 1.0;
  div_image(&local_c8,&local_218,&local_a8,&local_228);
  vVar4 = avg_image(this,&local_a8);
  uVar3 = vVar4.m_v._8_8_;
  fVar1 = vVar4.m_v[0];
  fVar2 = vVar4.m_v[1];
  if (local_c8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_c8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da;
    fVar2 = extraout_XMM0_Db;
  }
  if (local_1f8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_1f8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_00;
    fVar2 = extraout_XMM0_Db_00;
  }
  if (local_218.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_218.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_01;
    fVar2 = extraout_XMM0_Db_01;
  }
  if (local_a8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_a8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_02;
    fVar2 = extraout_XMM0_Db_02;
  }
  if (local_1c8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_1c8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_03;
    fVar2 = extraout_XMM0_Db_03;
  }
  if (local_1a8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_1a8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_04;
    fVar2 = extraout_XMM0_Db_04;
  }
  if (local_188.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_188.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_05;
    fVar2 = extraout_XMM0_Db_05;
  }
  if (local_168.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_168.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_06;
    fVar2 = extraout_XMM0_Db_06;
  }
  if (local_148.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_148.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_07;
    fVar2 = extraout_XMM0_Db_07;
  }
  if (local_128.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_128.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_08;
    fVar2 = extraout_XMM0_Db_08;
  }
  if (local_108.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_108.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_09;
    fVar2 = extraout_XMM0_Db_09;
  }
  if (local_e8.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_e8.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_10;
    fVar2 = extraout_XMM0_Db_10;
  }
  if (local_88.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_88.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_11;
    fVar2 = extraout_XMM0_Db_11;
  }
  if (local_38.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_38.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_12;
    fVar2 = extraout_XMM0_Db_12;
  }
  if (local_68.m_pixels.m_p != (vec<4U,_float> *)0x0) {
    free(local_68.m_pixels.m_p);
    fVar1 = extraout_XMM0_Da_13;
    fVar2 = extraout_XMM0_Db_13;
  }
  vVar4.m_v[1] = fVar2;
  vVar4.m_v[0] = fVar1;
  vVar4.m_v[2] = (float)(int)uVar3;
  vVar4.m_v[3] = (float)(int)((ulong)uVar3 >> 0x20);
  return (vec4F)vVar4.m_v;
}

Assistant:

vec4F compute_ssim(const imagef &a, const imagef &b)
	{
		imagef axb, a_sq, b_sq, mu1, mu2, mu1_sq, mu2_sq, mu1_mu2, s1_sq, s2_sq, s12, smap, t1, t2, t3;

		const float C1 = 6.50250f, C2 = 58.52250f;
				
		pow_image(a, a_sq, vec4F(2));
		pow_image(b, b_sq, vec4F(2));
		mul_image(a, b, axb, vec4F(1.0f));

		gaussian_filter(mu1, a, 11, 1.5f * 1.5f);
		gaussian_filter(mu2, b, 11, 1.5f * 1.5f);

		pow_image(mu1, mu1_sq, vec4F(2));
		pow_image(mu2, mu2_sq, vec4F(2));
		mul_image(mu1, mu2, mu1_mu2, vec4F(1.0f));

		gaussian_filter(s1_sq, a_sq, 11, 1.5f * 1.5f);
		add_weighted_image(s1_sq, vec4F(1), mu1_sq, vec4F(-1), vec4F(0), s1_sq);

		gaussian_filter(s2_sq, b_sq, 11, 1.5f * 1.5f);
		add_weighted_image(s2_sq, vec4F(1), mu2_sq, vec4F(-1), vec4F(0), s2_sq);

		gaussian_filter(s12, axb, 11, 1.5f * 1.5f);
		add_weighted_image(s12, vec4F(1), mu1_mu2, vec4F(-1), vec4F(0), s12);

		scale_image(mu1_mu2, t1, vec4F(2), vec4F(0));
		adds_image(t1, vec4F(C1), t1);

		scale_image(s12, t2, vec4F(2), vec4F(0));
		adds_image(t2, vec4F(C2), t2);

		mul_image(t1, t2, t3, vec4F(1));

		add_image(mu1_sq, mu2_sq, t1);
		adds_image(t1, vec4F(C1), t1);

		add_image(s1_sq, s2_sq, t2);
		adds_image(t2, vec4F(C2), t2);

		mul_image(t1, t2, t1, vec4F(1));

		div_image(t3, t1, smap, vec4F(1));

		return avg_image(smap);
	}